

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O0

bool __thiscall
PageStack<FinalizableObject_*>::Push(PageStack<FinalizableObject_*> *this,FinalizableObject *item)

{
  code *pcVar1;
  bool bVar2;
  Chunk *pCVar3;
  undefined4 *puVar4;
  Chunk *newChunk;
  FinalizableObject *item_local;
  PageStack<FinalizableObject_*> *this_local;
  
  if (this->nextEntry == this->chunkEnd) {
    pCVar3 = CreateChunk(this);
    if (pCVar3 == (Chunk *)0x0) {
      return false;
    }
    pCVar3->nextChunk = this->currentChunk;
    this->currentChunk = pCVar3;
    this->chunkStart = (FinalizableObject **)(this->currentChunk + 1);
    this->chunkEnd = (FinalizableObject **)(this->currentChunk + 0x80);
    this->nextEntry = this->chunkStart;
  }
  if ((this->nextEntry < this->chunkStart) || (this->chunkEnd <= this->nextEntry)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x84,"(nextEntry >= chunkStart && nextEntry < chunkEnd)",
                       "nextEntry >= chunkStart && nextEntry < chunkEnd");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  *this->nextEntry = item;
  this->nextEntry = this->nextEntry + 1;
  this->count = this->count + 1;
  if (this->count !=
      ((long)this->nextEntry - (long)this->chunkStart >> 3) + (this->pageCount - 1) * 0x1fc) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x8b,
                       "(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk)",
                       "count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return true;
}

Assistant:

inline
bool PageStack<T>::Push(T item)
{
    if (nextEntry == chunkEnd)
    {
        Chunk * newChunk = CreateChunk();
        if (newChunk == nullptr)
        {
            return false;
        }

        newChunk->nextChunk = currentChunk;
        currentChunk = newChunk;

        chunkStart = currentChunk->entries;
        chunkEnd = &currentChunk->entries[EntriesPerChunk];
        nextEntry = chunkStart;
    }

    Assert(nextEntry >= chunkStart && nextEntry < chunkEnd);

    *nextEntry = item;
    nextEntry++;

#if DBG
    count++;
    Assert(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk);
#endif

    return true;
}